

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-hang-loop.c
# Opt level: O3

void idle_cb(uv_idle_t *handle)

{
  int iVar1;
  uv_udp_send_t *puVar2;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_28 [8];
  void *local_10;
  void *local_8;
  
  if (send_req.handle == (uv_udp_t *)0x0) {
    if (handle != &idle_handle) goto LAB_001e15f2;
    iVar1 = uv_idle_stop(&idle_handle);
    local_8 = (void *)(long)iVar1;
    local_10 = (void *)0x0;
    if (local_8 != (void *)0x0) goto LAB_001e15f7;
    if (999 < loop_hang_called) {
      loop_hang_called = loop_hang_called + 1;
      uv_close(&client,0);
      uv_close(&idle_handle,0);
      return;
    }
    loop_hang_called = loop_hang_called + 1;
    iVar1 = uv_udp_send(&send_req,&client,&buf,1,&addr,send_cb);
    local_8 = (void *)(long)iVar1;
    local_10 = (void *)0x0;
    if (local_8 == (void *)0x0) {
      return;
    }
  }
  else {
    idle_cb_cold_1();
LAB_001e15f2:
    idle_cb_cold_2();
LAB_001e15f7:
    idle_cb_cold_3();
  }
  puVar2 = (uv_udp_send_t *)&stack0xfffffffffffffff8;
  iVar1 = (int)&stack0xfffffffffffffff0;
  idle_cb_cold_4();
  if (puVar2 == (uv_udp_send_t *)0x0) {
    send_cb_cold_5();
LAB_001e167e:
    send_cb_cold_1();
LAB_001e1686:
    send_cb_cold_2();
  }
  else {
    if ((iVar1 != -0x65) && (iVar1 != 0)) goto LAB_001e1698;
    if (puVar2->handle != &client) goto LAB_001e167e;
    if (puVar2 != &send_req) goto LAB_001e1686;
    send_req.handle = (uv_udp_t *)0x0;
    iVar1 = uv_idle_start(&idle_handle,idle_cb);
    auStack_28 = (undefined1  [8])(long)iVar1;
    if (auStack_28 == (undefined1  [8])0x0) {
      return;
    }
  }
  puVar2 = (uv_udp_send_t *)auStack_28;
  send_cb_cold_3();
LAB_001e1698:
  send_cb_cold_4();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(puVar2,0);
  return;
}

Assistant:

static void idle_cb(uv_idle_t* handle) {
  int r;

  ASSERT_NULL(send_req.handle);
  CHECK_OBJECT(handle, uv_idle_t, idle_handle);
  ASSERT_OK(uv_idle_stop(handle));

  /* It probably would have stalled by now if it's going to stall at all. */
  if (++loop_hang_called > 1000) {
    uv_close((uv_handle_t*) &client, NULL);
    uv_close((uv_handle_t*) &idle_handle, NULL);
    return;
  }

  r = uv_udp_send(&send_req,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  send_cb);
  ASSERT_OK(r);
}